

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::TexSubImageCubeArrayDepthCase::createTexture
          (TexSubImageCubeArrayDepthCase *this)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int depth;
  int xoffset;
  int zoffset;
  TransferFormat TVar5;
  char *str;
  void *pvVar6;
  PixelBufferAccess local_1a0;
  PixelBufferAccess local_178;
  int local_14c;
  undefined1 local_148 [4];
  int cellSize;
  Vec4 colorB;
  Vec4 colorA;
  int z;
  int y;
  int x;
  int d;
  int h;
  int w;
  int levelW_1;
  int ndx_1;
  PixelBufferAccess local_e0;
  undefined1 local_b4 [8];
  Vec4 gMax;
  Vec4 gMin;
  int levelW;
  int ndx;
  TextureFormat local_80;
  undefined1 local_78 [8];
  TextureLevel levelData;
  undefined1 local_48 [4];
  deUint32 tex;
  Random rnd;
  deUint32 local_30;
  deUint32 dStack_2c;
  TransferFormat fmt;
  TexSubImageCubeArrayDepthCase *this_local;
  
  rnd.m_rnd._8_8_ = (this->super_TextureCubeArraySpecCase).m_texFormat;
  TVar5 = glu::getTransferFormat((TextureFormat)rnd.m_rnd._8_8_);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)local_48,dVar1);
  levelData.m_data.m_cap._4_4_ = 0;
  local_30 = TVar5.format;
  dStack_2c = TVar5.dataType;
  local_80 = glu::mapGLTransferFormat(local_30,dStack_2c);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_78,&local_80);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)((long)&levelData.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x9009,levelData.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0xcf5,1);
  dVar1 = sglr::ContextWrapper::glGetError
                    (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.
                      super_ContextWrapper);
  glu::checkError(dVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
                  ,0x295);
  for (gMin.m_data[3] = 0.0;
      (int)gMin.m_data[3] < (this->super_TextureCubeArraySpecCase).m_numLevels;
      gMin.m_data[3] = (float)((int)gMin.m_data[3] + 1)) {
    iVar2 = de::max<int>(1,(this->super_TextureCubeArraySpecCase).m_size >>
                           (gMin.m_data[3]._0_1_ & 0x1f));
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),-1.5,-2.0,1.7,-1.5);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_b4,2.0,1.5,-1.0,2.0);
    tcu::TextureLevel::setSize
              ((TextureLevel *)local_78,iVar2,iVar2,(this->super_TextureCubeArraySpecCase).m_depth);
    tcu::TextureLevel::getAccess(&local_e0,(TextureLevel *)local_78);
    tcu::fillWithComponentGradients(&local_e0,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_b4);
    iVar3 = (this->super_TextureCubeArraySpecCase).m_depth;
    iVar4 = *(int *)&(this->super_TextureCubeArraySpecCase).field_0xd4;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&levelW_1,(TextureLevel *)local_78);
    pvVar6 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&levelW_1);
    sglr::ContextWrapper::glTexImage3D
              (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
               0x9009,(int)gMin.m_data[3],iVar4,iVar2,iVar2,iVar3,0,local_30,dStack_2c,pvVar6);
  }
  for (w = 0; w < (this->super_TextureCubeArraySpecCase).m_numLevels; w = w + 1) {
    iVar3 = de::max<int>(1,(this->super_TextureCubeArraySpecCase).m_size >> ((byte)w & 0x1f));
    iVar4 = de::Random::getInt((Random *)local_48,1,iVar3);
    iVar2 = de::Random::getInt((Random *)local_48,1,iVar3);
    depth = de::Random::getInt((Random *)local_48,1,(this->super_TextureCubeArraySpecCase).m_depth);
    xoffset = de::Random::getInt((Random *)local_48,0,iVar3 - iVar4);
    iVar3 = de::Random::getInt((Random *)local_48,0,iVar3 - iVar2);
    zoffset = de::Random::getInt((Random *)local_48,0,
                                 (this->super_TextureCubeArraySpecCase).m_depth - depth);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),2.0,1.5,-1.0,2.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_148,-1.5,-2.0,1.7,-1.5);
    local_14c = de::Random::getInt((Random *)local_48,2,0x10);
    tcu::TextureLevel::setSize((TextureLevel *)local_78,iVar4,iVar2,depth);
    tcu::TextureLevel::getAccess(&local_178,(TextureLevel *)local_78);
    tcu::fillWithGrid(&local_178,local_14c,(Vec4 *)(colorB.m_data + 2),(Vec4 *)local_148);
    tcu::TextureLevel::getAccess(&local_1a0,(TextureLevel *)local_78);
    pvVar6 = tcu::PixelBufferAccess::getDataPtr(&local_1a0);
    sglr::ContextWrapper::glTexSubImage3D
              (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
               0x9009,w,xoffset,iVar3,zoffset,iVar4,iVar2,depth,local_30,dStack_2c,pvVar6);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_78);
  de::Random::~Random((Random *)local_48);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat	fmt			= glu::getTransferFormat(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(fmt.format, fmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		GLU_CHECK();

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int   levelW		= de::max(1, m_size >> ndx);
			const Vec4  gMin		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4  gMax		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			levelData.setSize(levelW, levelW, m_depth);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, ndx, m_internalFormat, levelW, levelW, m_depth, 0, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int	levelW		= de::max(1, m_size >> ndx);

			const int	w			= rnd.getInt(1, levelW);
			const int	h			= rnd.getInt(1, levelW);
			const int	d			= rnd.getInt(1, m_depth);
			const int	x			= rnd.getInt(0, levelW-w);
			const int	y			= rnd.getInt(0, levelW-h);
			const int	z			= rnd.getInt(0, m_depth-d);

			const Vec4	colorA		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);
			const Vec4	colorB		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const int	cellSize	= rnd.getInt(2, 16);

			levelData.setSize(w, h, d);
			tcu::fillWithGrid(levelData.getAccess(), cellSize, colorA, colorB);

			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, ndx, x, y, z, w, h, d, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}
	}